

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_chunk_test.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_0::CollectFieldsTest_AllDifferentChunks_Test::
CollectFieldsTest_AllDifferentChunks_Test(CollectFieldsTest_AllDifferentChunks_Test *this)

{
  CollectFieldsTest_AllDifferentChunks_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__CollectFieldsTest_AllDifferentChunks_Test_02a003d8;
  return;
}

Assistant:

TEST(CollectFieldsTest, AllDifferentChunks) {
  const char* field_names[] = {"repeated_int32", "optional_int32",
                               "optional_int64"};

  auto chunks = CreateAndCollectFields<TestAllTypes>(
      field_names, [](const FieldDescriptor* lhs, const FieldDescriptor* rhs) {
        return false;
      });

  EXPECT_EQ(chunks.size(), 3);
}